

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevII.cpp
# Opt level: O0

void __thiscall
Iir::ChebyshevII::AnalogLowShelf::design
          (AnalogLowShelf *this,int numPoles,double gainDb,double stopBandDb)

{
  int iVar1;
  double dVar2;
  uint in_ESI;
  LayoutBase *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double dVar5;
  LayoutBase *this_00;
  complex_t *pole;
  complex_t *zero;
  PoleZeroPair *in_XMM1_Qa;
  double cs;
  double sn;
  double a;
  int i;
  int pairs;
  double n2;
  double cosh_v;
  double cosh_u;
  double sinh_v;
  double sinh_u;
  double v;
  double u;
  double b;
  double eps;
  double g0;
  double G0;
  double Gb;
  double G;
  complex<double> local_e8;
  complex<double> local_d8;
  complex<double> local_c8;
  complex<double> local_b8;
  double local_a8;
  complex_t *in_stack_ffffffffffffff60;
  complex_t *in_stack_ffffffffffffff68;
  int iVar6;
  double local_48;
  PoleZeroPair *local_20;
  
  if ((((in_RDI[1].m_numPoles != in_ESI) || ((double)in_RDI[1].m_pair != (double)in_XMM1_Qa)) ||
      (NAN((double)in_RDI[1].m_pair) || NAN((double)in_XMM1_Qa))) ||
     ((in_RDI[1].m_normalW != in_XMM0_Qa || (NAN(in_RDI[1].m_normalW) || NAN(in_XMM0_Qa))))) {
    in_RDI[1].m_numPoles = in_ESI;
    in_RDI[1].m_pair = in_XMM1_Qa;
    in_RDI[1].m_normalW = in_XMM0_Qa;
    LayoutBase::reset(in_RDI);
    dVar2 = -in_XMM0_Qa;
    local_20 = in_XMM1_Qa;
    if (ABS(dVar2) <= (double)in_XMM1_Qa) {
      local_20 = (PoleZeroPair *)ABS(dVar2);
    }
    if (dVar2 < 0.0) {
      local_20 = (PoleZeroPair *)((ulong)local_20 ^ 0x8000000000000000);
    }
    dVar3 = pow(10.0,dVar2 / 20.0);
    dVar2 = pow(10.0,(dVar2 - (double)local_20) / 20.0);
    dVar4 = pow(1.0,1.0 / (double)(int)in_ESI);
    if ((dVar2 != 1.0) || (NAN(dVar2))) {
      local_48 = sqrt((dVar3 * dVar3 + -(dVar2 * dVar2)) / (dVar2 * dVar2 + -1.0));
    }
    else {
      local_48 = dVar3 - 1.0;
    }
    dVar5 = sqrt(1.0 / (local_48 * local_48) + 1.0);
    dVar2 = pow(dVar2 * dVar5 + dVar3 / local_48,1.0 / (double)(int)in_ESI);
    dVar2 = log(dVar2 / dVar4);
    dVar3 = sqrt(1.0 / (local_48 * local_48) + 1.0);
    dVar3 = pow(1.0 / local_48 + dVar3,1.0 / (double)(int)in_ESI);
    this_00 = (LayoutBase *)log(dVar3);
    pole = (complex_t *)sinh(dVar2);
    zero = (complex_t *)sinh((double)this_00);
    dVar2 = cosh(dVar2);
    dVar3 = cosh((double)this_00);
    iVar1 = (int)in_ESI / 2;
    for (iVar6 = 1; iVar6 <= iVar1; iVar6 = iVar6 + 1) {
      in_stack_ffffffffffffff68 =
           (complex_t *)
           (((double)(iVar6 * 2 + -1) * 3.141592653589793) / (double)(int)(in_ESI << 1));
      in_stack_ffffffffffffff60 = (complex_t *)sin((double)in_stack_ffffffffffffff68);
      local_a8 = cos((double)in_stack_ffffffffffffff68);
      std::complex<double>::complex
                (&local_b8,-(double)in_stack_ffffffffffffff60 * (double)pole,local_a8 * dVar2);
      std::complex<double>::complex
                (&local_c8,-(double)in_stack_ffffffffffffff60 * (double)zero,local_a8 * dVar3);
      LayoutBase::addPoleZeroConjugatePairs(this_00,pole,zero);
    }
    if ((in_ESI & 1) != 0) {
      std::complex<double>::complex(&local_d8,-(double)pole,0.0);
      std::complex<double>::complex(&local_e8,-(double)zero,0.0);
      LayoutBase::add((LayoutBase *)CONCAT44(iVar1,iVar6),in_stack_ffffffffffffff68,
                      in_stack_ffffffffffffff60);
    }
  }
  return;
}

Assistant:

void AnalogLowShelf::design (int numPoles,
                             double gainDb,
                             double stopBandDb)
{
  if (m_numPoles != numPoles ||
      m_stopBandDb != stopBandDb ||
      m_gainDb != gainDb)
  {
    m_numPoles = numPoles;
    m_stopBandDb = stopBandDb;
    m_gainDb = gainDb;

    reset ();

    gainDb = -gainDb;

    if (stopBandDb >= fabs(gainDb))
      stopBandDb = fabs (gainDb);
    if (gainDb<0)
      stopBandDb = -stopBandDb;

    const double G  = std::pow (10., gainDb / 20.0 );
    const double Gb = std::pow (10., (gainDb - stopBandDb) / 20.0);
    const double G0 = 1;
    const double g0 = pow (G0 , 1. / numPoles);

    double eps;
    if (Gb != G0 )
      eps = sqrt((G*G-Gb*Gb)/(Gb*Gb-G0*G0));
    else
      eps = G-1; // This is surely wrong

    const double b = pow (G/eps+Gb*sqrt(1+1/(eps*eps)), 1./numPoles);
    const double u = log (b / g0);
    const double v = log (pow (1. / eps+sqrt(1+1/(eps*eps)),1./numPoles));
    
    const double sinh_u = sinh (u);
    const double sinh_v = sinh (v);
    const double cosh_u = cosh (u);
    const double cosh_v = cosh (v);
    const double n2 = 2 * numPoles;
    const int pairs = numPoles / 2;
    for (int i = 1; i <= pairs; ++i)
    {
      const double a = doublePi * (2 * i - 1) / n2;
      const double sn = sin (a);
      const double cs = cos (a);
      addPoleZeroConjugatePairs (complex_t (-sn * sinh_u, cs * cosh_u),
                                       complex_t (-sn * sinh_v, cs * cosh_v));
    }

    if (numPoles & 1)
      add (-sinh_u, -sinh_v);
  }
}